

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O2

uint add_not_list_to_class
               (uint8_t *classbits,PCRE2_UCHAR16 **uchardptr,uint32_t options,compile_block_16 *cb,
               uint32_t *p)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t start;
  
  if (*p != 0) {
    add_to_class(classbits,uchardptr,options,cb,0,*p - 1);
  }
  while (uVar2 = *p, *p != 0xffffffff) {
    do {
      uVar1 = p[1];
      p = p + 1;
      start = uVar2 + 1;
      uVar2 = uVar1;
    } while (uVar1 == start);
    uVar2 = uVar1 - 1;
    if (uVar1 == 0xffffffff) {
      uVar2 = ((options >> 0x13 & 1) != 0) - 1 | 0x10ffff;
    }
    add_to_class(classbits,uchardptr,options,cb,start,uVar2);
  }
  return 0xffffffff;
}

Assistant:

static unsigned int
add_not_list_to_class(uint8_t *classbits, PCRE2_UCHAR **uchardptr,
  uint32_t options, compile_block *cb, const uint32_t *p)
{
BOOL utf = (options & PCRE2_UTF) != 0;
unsigned int n8 = 0;
if (p[0] > 0)
  n8 += add_to_class(classbits, uchardptr, options, cb, 0, p[0] - 1);
while (p[0] < NOTACHAR)
  {
  while (p[1] == p[0] + 1) p++;
  n8 += add_to_class(classbits, uchardptr, options, cb, p[0] + 1,
    (p[1] == NOTACHAR) ? (utf ? 0x10ffffu : 0xffffffffu) : p[1] - 1);
  p++;
  }
return n8;
}